

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idhash.c
# Opt level: O0

_Bool nni_id_visit(nni_id_map *m,uint64_t *keyp,void **valp,uint32_t *cursor)

{
  uint local_34;
  uint32_t index;
  uint32_t *cursor_local;
  void **valp_local;
  uint64_t *keyp_local;
  nni_id_map *m_local;
  
  local_34 = *cursor;
  while( true ) {
    if (m->id_cap <= local_34) {
      *cursor = local_34;
      return false;
    }
    if (m->id_entries[local_34].val != (void *)0x0) break;
    local_34 = local_34 + 1;
  }
  if (valp != (void **)0x0) {
    *valp = m->id_entries[local_34].val;
  }
  if (keyp != (uint64_t *)0x0) {
    *keyp = m->id_entries[local_34].key;
  }
  *cursor = local_34 + 1;
  return true;
}

Assistant:

bool
nni_id_visit(nni_id_map *m, uint64_t *keyp, void **valp, uint32_t *cursor)
{
	// cursor is just a cursor into the table
	uint32_t index = *cursor;
	while (index < m->id_cap) {
		if (m->id_entries[index].val != NULL) {
			if (valp != NULL) {
				*valp = m->id_entries[index].val;
			}
			if (keyp != NULL) {
				*keyp = m->id_entries[index].key;
			}
			*cursor = index + 1;
			return true;
		}
		index++;
	}
	*cursor = index;
	return (false);
}